

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall pybind11::detail::generic_type::initialize(generic_type *this,type_record *rec)

{
  char *pcVar1;
  initializer_list<pybind11::detail::type_info_*> __l;
  bool bVar2;
  PyObject *pPVar3;
  type_info *this_00;
  size_t sVar4;
  mapped_type *pmVar5;
  type_map<type_info_*> *this_01;
  mapped_type *pptVar6;
  mapped_type *this_02;
  PyTypeObject *type;
  type_info *ptVar7;
  type_info *__rhs;
  type_info *local_1a8;
  handle local_188;
  PyObject *local_180;
  handle local_178;
  list_accessor local_170;
  type_info *local_150;
  type_info *parent_tinfo;
  type_info *local_140;
  iterator local_138;
  size_type local_130;
  type_index local_128;
  type_index tindex;
  internals *internals;
  type_info *tinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  type_index local_a8;
  type_index local_a0 [3];
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  PyObject *local_20;
  type_record *local_18;
  type_record *rec_local;
  generic_type *this_local;
  
  local_18 = rec;
  rec_local = (type_record *)this;
  bVar2 = pybind11::handle::operator_cast_to_bool(&rec->scope);
  if (bVar2) {
    local_20 = (local_18->scope).m_ptr;
    bVar2 = hasattr((handle)local_20,local_18->name);
    if (bVar2) {
      pcVar1 = local_18->name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,pcVar1,&local_81);
      std::operator+(&local_60,"generic_type: cannot initialize type \"",&local_80);
      std::operator+(&local_40,&local_60,"\": an object with that name is already defined");
      pybind11_fail(&local_40);
    }
  }
  if (((byte)local_18->field_0x60 >> 4 & 1) == 0) {
    __rhs = local_18->type;
    std::type_index::type_index(&local_a8,__rhs);
    local_1a8 = get_global_type_info(&local_a8);
  }
  else {
    __rhs = local_18->type;
    std::type_index::type_index(local_a0,__rhs);
    local_1a8 = get_local_type_info(local_a0);
  }
  if (local_1a8 == (type_info *)0x0) {
    pPVar3 = make_new_python_type(local_18);
    (this->super_object).super_handle.m_ptr = pPVar3;
    this_00 = (type_info *)operator_new(0x98);
    this_00->get_buffer_data = (void *)0x0;
    this_00->module_local_load = (_func_void_ptr_PyObject_ptr_type_info_ptr *)0x0;
    this_00->direct_conversions =
         (vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_> *)0x0;
    this_00->get_buffer = (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0;
    (this_00->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->implicit_casts).
    super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->implicit_conversions).
    super__Vector_base<_object_*(*)(_object_*,__typeobject_*),_std::allocator<_object_*(*)(_object_*,__typeobject_*)>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00->init_instance = (_func_void_instance_ptr_void_ptr *)0x0;
    this_00->dealloc = (type *)0x0;
    this_00->holder_size_in_ptrs = 0;
    this_00->operator_new = (_func_void_ptr_size_t *)0x0;
    this_00->type_size = 0;
    this_00->type_align = 0;
    this_00->type = (PyTypeObject *)0x0;
    this_00->cpptype = (type_info *)0x0;
    *(undefined8 *)&this_00->field_0x90 = 0;
    type_info::type_info(this_00);
    this_00->type = (PyTypeObject *)(this->super_object).super_handle.m_ptr;
    this_00->cpptype = local_18->type;
    this_00->type_size = local_18->type_size;
    this_00->type_align = local_18->type_align;
    this_00->operator_new = local_18->operator_new;
    sVar4 = size_in_ptrs((detail *)local_18->holder_size,(size_t)__rhs);
    this_00->holder_size_in_ptrs = sVar4;
    this_00->init_instance = local_18->init_instance;
    this_00->dealloc = local_18->dealloc;
    this_00->field_0x90 = this_00->field_0x90 | 1;
    this_00->field_0x90 = this_00->field_0x90 | 2;
    this_00->field_0x90 = this_00->field_0x90 & 0xfb | (byte)local_18->field_0x60 >> 1 & 4;
    this_00->field_0x90 = this_00->field_0x90 & 0xf7 | ((byte)local_18->field_0x60 >> 4 & 1) << 3;
    tindex._M_target = (type_info *)get_internals();
    std::type_index::type_index(&local_128,local_18->type);
    pmVar5 = std::
             unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
             ::operator[]((unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
                           *)(tindex._M_target + 0xe0),&local_128);
    this_00->direct_conversions = pmVar5;
    if (((byte)local_18->field_0x60 >> 4 & 1) == 0) {
      pptVar6 = std::
                unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                ::operator[]((unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                              *)tindex._M_target,&local_128);
      *pptVar6 = this_00;
    }
    else {
      this_01 = registered_local_types_cpp();
      pptVar6 = std::
                unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
                ::operator[](this_01,&local_128);
      *pptVar6 = this_00;
    }
    local_138 = &local_140;
    local_130 = 1;
    parent_tinfo = (type_info *)(this->super_object).super_handle.m_ptr;
    local_140 = this_00;
    this_02 = std::
              unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
              ::operator[]((unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
                            *)(tindex._M_target + 0x38),(key_type *)&parent_tinfo);
    __l._M_len = local_130;
    __l._M_array = local_138;
    std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
    operator=(this_02,__l);
    sVar4 = list::size(&local_18->bases);
    if ((sVar4 < 2) && ((local_18->field_0x60 & 1) == 0)) {
      sVar4 = list::size(&local_18->bases);
      if (sVar4 == 1) {
        list::operator[](&local_170,&local_18->bases,0);
        type = (PyTypeObject *)
               accessor<pybind11::detail::accessor_policies::list_item>::ptr(&local_170);
        ptVar7 = get_type_info(type);
        accessor<pybind11::detail::accessor_policies::list_item>::~accessor(&local_170);
        this_00->field_0x90 = this_00->field_0x90 & 0xfd | ((byte)ptVar7->field_0x90 >> 1 & 1) << 1;
        local_150 = ptVar7;
      }
    }
    else {
      mark_parents_nonsimple(this,this_00->type);
      this_00->field_0x90 = this_00->field_0x90 & 0xfd;
    }
    if (((byte)local_18->field_0x60 >> 4 & 1) != 0) {
      this_00->module_local_load = type_caster_generic::local_load;
      pybind11::handle::handle(&local_178,(this->super_object).super_handle.m_ptr);
      capsule::capsule((capsule *)&local_188,this_00,(char *)0x0,(_func_void_PyObject_ptr *)0x0);
      local_180 = local_188.m_ptr;
      setattr(local_178,"__pybind11_module_local_v3__",local_188);
      capsule::~capsule((capsule *)&local_188);
    }
    return;
  }
  pcVar1 = local_18->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar1,(allocator *)((long)&tinfo + 7));
  std::operator+(&local_e8,"generic_type: type \"",&local_108);
  std::operator+(&local_c8,&local_e8,"\" is already registered!");
  pybind11_fail(&local_c8);
}

Assistant:

void initialize(const type_record &rec) {
        if (rec.scope && hasattr(rec.scope, rec.name))
            pybind11_fail("generic_type: cannot initialize type \"" + std::string(rec.name) +
                          "\": an object with that name is already defined");

        if (rec.module_local ? get_local_type_info(*rec.type) : get_global_type_info(*rec.type))
            pybind11_fail("generic_type: type \"" + std::string(rec.name) +
                          "\" is already registered!");

        m_ptr = make_new_python_type(rec);

        /* Register supplemental type information in C++ dict */
        auto *tinfo = new detail::type_info();
        tinfo->type = (PyTypeObject *) m_ptr;
        tinfo->cpptype = rec.type;
        tinfo->type_size = rec.type_size;
        tinfo->type_align = rec.type_align;
        tinfo->operator_new = rec.operator_new;
        tinfo->holder_size_in_ptrs = size_in_ptrs(rec.holder_size);
        tinfo->init_instance = rec.init_instance;
        tinfo->dealloc = rec.dealloc;
        tinfo->simple_type = true;
        tinfo->simple_ancestors = true;
        tinfo->default_holder = rec.default_holder;
        tinfo->module_local = rec.module_local;

        auto &internals = get_internals();
        auto tindex = std::type_index(*rec.type);
        tinfo->direct_conversions = &internals.direct_conversions[tindex];
        if (rec.module_local)
            registered_local_types_cpp()[tindex] = tinfo;
        else
            internals.registered_types_cpp[tindex] = tinfo;
        internals.registered_types_py[(PyTypeObject *) m_ptr] = { tinfo };

        if (rec.bases.size() > 1 || rec.multiple_inheritance) {
            mark_parents_nonsimple(tinfo->type);
            tinfo->simple_ancestors = false;
        }
        else if (rec.bases.size() == 1) {
            auto parent_tinfo = get_type_info((PyTypeObject *) rec.bases[0].ptr());
            tinfo->simple_ancestors = parent_tinfo->simple_ancestors;
        }

        if (rec.module_local) {
            // Stash the local typeinfo and loader so that external modules can access it.
            tinfo->module_local_load = &type_caster_generic::local_load;
            setattr(m_ptr, PYBIND11_MODULE_LOCAL_ID, capsule(tinfo));
        }
    }